

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

void mxx::allgatherv<int>
               (int *data,size_t size,int *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  ulong uVar4;
  vector<int,_std::allocator<int>_> counts;
  datatype dt_1;
  vector<int,_std::allocator<int>_> displs;
  datatype mpi_sizet;
  
  puVar2 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = 0;
  puVar1 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar3 = puVar1; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    uVar4 = uVar4 + *puVar3;
  }
  if ((long)puVar2 - (long)puVar1 >> 3 != (long)comm->m_size) {
    assert_fail("recv_sizes.size() == static_cast<size_t>(comm.size())",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                ,0x3e3,"allgatherv");
  }
  mpi_sizet._vptr_datatype = (_func_int **)&PTR__datatype_00171c90;
  mpi_sizet.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  mpi_sizet.builtin = true;
  if (uVar4 < 0x7fffffff) {
    dt_1._vptr_datatype = (_func_int **)&PTR__datatype_00171c90;
    dt_1.mpitype = (MPI_Datatype)&ompi_mpi_int;
    dt_1.builtin = true;
    std::vector<int,_std::allocator<int>_>::vector
              (&counts,(long)comm->m_size,(allocator_type *)&displs);
    std::
    __copy_move_a<false,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start);
    impl::get_displacements<int>(&displs,&counts);
    MPI_Allgatherv(data,size & 0xffffffff,dt_1.mpitype,out,
                   counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,dt_1.mpitype,comm->mpi_comm);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&displs.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&counts.super__Vector_base<int,_std::allocator<int>_>);
    datatype::~datatype(&dt_1);
  }
  else {
    impl::allgatherv_big<int>(data,size,out,recv_sizes,comm);
  }
  datatype::~datatype(&mpi_sizet);
  return;
}

Assistant:

void allgatherv(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), static_cast<size_t>(0));
    MXX_ASSERT(recv_sizes.size() == static_cast<size_t>(comm.size()));
    mxx::datatype mpi_sizet = mxx::get_datatype<size_t>();
    if (total_size >= mxx::max_int) {
        // use custom implementation for large sizes
        impl::allgatherv_big(data, size, out, recv_sizes, comm);
    } else {
        // use standard MPI_Gatherv
        mxx::datatype dt = mxx::get_datatype<T>();
        std::vector<int> counts(comm.size());
        std::copy(recv_sizes.begin(), recv_sizes.end(), counts.begin());
        std::vector<int> displs = impl::get_displacements(counts);
        MPI_Allgatherv(const_cast<T*>(data), size, dt.type(),
                    out, &counts[0], &displs[0], dt.type(), comm);
    }
}